

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kernel.cpp
# Opt level: O2

void __thiscall Kernel::print(Kernel *this)

{
  int iVar1;
  char *__rhs;
  int iVar2;
  int iVar3;
  ulong uVar4;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar1 = this->height;
  uVar4 = (long)iVar1 / -2 & 0xffffffff;
  while (iVar2 = (int)uVar4, iVar2 <= iVar1 / 2) {
    *(undefined8 *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) = 0xc;
    if (iVar2 == 0) {
      std::__cxx11::to_string(&local_70,this->scale);
      std::operator+(&local_50,&local_70," x ");
      std::operator<<((ostream *)&std::cout,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
    }
    else {
      std::operator<<((ostream *)&std::cout,"");
    }
    iVar1 = this->width;
    uVar4 = (long)iVar1 / -2 & 0xffffffff;
    while( true ) {
      iVar3 = (int)uVar4;
      if (iVar1 / 2 < iVar3) break;
      *(undefined8 *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) = 0xc;
      std::__cxx11::to_string
                (&local_70,
                 (this->weights).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar1 * (this->yoff + iVar2) + this->xoff + iVar3]
                );
      __rhs = "\n";
      if (iVar3 != this->width / 2) {
        __rhs = ", ";
      }
      std::operator+(&local_50,&local_70,__rhs);
      std::operator<<((ostream *)&std::cout,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      uVar4 = (ulong)(iVar3 + 1);
      iVar1 = this->width;
    }
    iVar1 = this->height;
    uVar4 = (ulong)(iVar2 + 1);
  }
  return;
}

Assistant:

void Kernel::print() {
  for (int y = -height / 2; y <= height / 2; y++) {
    if (y == 0) {
      std::cout << std::setw(12) << (std::to_string(scale) + " x ");
    } else {
      std::cout << std::setw(12) << "";
    }
    for (int x = -width / 2; x <= width / 2; x++) {
      std::cout << std::setw(12) << (std::to_string(this->operator()(x, y)) + (x != width / 2 ? ", " : "\n"));
    }
  }
}